

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

uint32_t cpu_ldl_data_mips64(CPUArchState_conflict11 *env,target_ulong ptr)

{
  uint32_t uVar1;
  
  uVar1 = cpu_ldl_data_ra_mips64(env,ptr,0);
  return uVar1;
}

Assistant:

uint32_t cpu_ldl_data(CPUArchState *env, target_ulong ptr)
{
    return cpu_ldl_data_ra(env, ptr, 0);
}